

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RC4.cc
# Opt level: O2

void __thiscall Pl_RC4::finish(Pl_RC4 *this)

{
  __shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_18._M_ptr = (element_type *)0x0;
  local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->outbuf).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>,&local_18
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  (*((this->super_Pipeline).next_)->_vptr_Pipeline[3])();
  return;
}

Assistant:

void
Pl_RC4::finish()
{
    outbuf = nullptr;
    next()->finish();
}